

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall soul::StructuralParser::parseBitwiseAnd(StructuralParser *this)

{
  char *__s1;
  int iVar1;
  Expression *a;
  Expression *b;
  Context context;
  Context local_38;
  
  a = parseEqualityOperator(this);
  do {
    __s1 = (this->super_SOULTokeniser).currentType.text;
    if (__s1 != "&") {
      if (__s1 == (char *)0x0) {
        return a;
      }
      iVar1 = strcmp(__s1,"&");
      if (iVar1 != 0) {
        return a;
      }
    }
    local_38.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
    if (local_38.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_38.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_38.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_38.location.location.data = (this->super_SOULTokeniser).location.location.data;
    local_38.parentScope = this->currentScope;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    b = parseEqualityOperator(this);
    a = createBinaryOperator(this,&local_38,a,b,bitwiseAnd);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_38.location.sourceCode.object);
  } while( true );
}

Assistant:

AST::Expression& parseBitwiseAnd()
    {
        for (pool_ref<AST::Expression> a = parseEqualityOperator();;)
        {
            if (! matches (Operator::bitwiseAnd))
                return a;

            auto context = getContext();
            skip();
            a = createBinaryOperator (context, a, parseEqualityOperator(), BinaryOp::Op::bitwiseAnd);
        }
    }